

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-blows.c
# Opt level: O0

void display_blow_message_vs_monster(blow_method *method,char *m_name,wchar_t t_idx)

{
  _Bool _Var1;
  char *s;
  char *local_30;
  char *fullstop;
  char *act;
  wchar_t t_idx_local;
  char *m_name_local;
  blow_method *method_local;
  
  s = monster_blow_method_action(method,t_idx);
  if (s != (char *)0x0) {
    local_30 = ".";
    _Var1 = suffix(s,"\'");
    if ((_Var1) || (_Var1 = suffix(s,"!"), _Var1)) {
      local_30 = "";
    }
    msgt(method->msgt,"%s %s%s",m_name,s,local_30);
    string_free(s);
  }
  return;
}

Assistant:

static void display_blow_message_vs_monster(const struct blow_method *method,
		const char *m_name, int t_idx)
{
	char *act = monster_blow_method_action(method, t_idx);

	if (act) {
		const char *fullstop = ".";

		if (suffix(act, "'") || suffix(act, "!")) {
			fullstop = "";
		}
		msgt(method->msgt, "%s %s%s", m_name, act, fullstop);
		string_free(act);
	}
}